

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_delete.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  __type _Var1;
  int iVar2;
  htEntry *phVar3;
  ostream *poVar4;
  string *__lhs;
  size_t para;
  size_t para_00;
  ulong __val;
  void *pvVar5;
  char *__assertion;
  unsigned_long uVar6;
  string local_d0;
  string local_b0;
  HotRing ht;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  HotRingInstance::HotRing::HotRing(&ht,3000);
  for (uVar6 = 0; uVar6 != 30000; uVar6 = uVar6 + 1) {
    std::__cxx11::to_string(&local_b0,uVar6);
    std::__cxx11::to_string(&local_d0,uVar6);
    std::operator+(&local_50,&local_d0,"a");
    std::__cxx11::string::~string((string *)&local_d0);
    HotRingInstance::HotRing::insert(&ht,&local_b0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (uVar6 = 0; uVar6 != 15000; uVar6 = uVar6 + 1) {
    std::__cxx11::to_string(&local_d0,uVar6);
    iVar2 = HotRingInstance::HotRing::remove(&ht,(char *)&local_d0);
    if ((char)iVar2 == '\0') {
      __assertion = "ht.remove(to_string(i))";
      __line = 0x1a;
      goto LAB_00102671;
    }
    std::__cxx11::string::~string((string *)&local_d0);
  }
  for (__val = 0; __val != 30000; __val = __val + 1) {
    if (__val < 15000) {
      std::__cxx11::to_string(&local_d0,__val);
      phVar3 = HotRingInstance::HotRing::search(&ht,&local_d0);
      if (phVar3 != (htEntry *)0x0) {
        __assertion = "!ht.search(to_string(i))";
        __line = 0x1f;
        goto LAB_00102671;
      }
    }
    else {
      std::__cxx11::to_string(&local_d0,__val);
      phVar3 = HotRingInstance::HotRing::search(&ht,&local_d0);
      if (phVar3 == (htEntry *)0x0) {
        __assertion = "ht.search(to_string(i))";
        __line = 0x21;
        goto LAB_00102671;
      }
    }
    std::__cxx11::string::~string((string *)&local_d0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Pass remove test.\n");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar6 = 30000;
  do {
    if (uVar6 == 60000) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Pass remove out of bound test.\n");
      std::endl<char,std::char_traits<char>>(poVar4);
      for (pvVar5 = (void *)0x3a98; pvVar5 != (void *)0x7530; pvVar5 = (void *)((long)pvVar5 + 1)) {
        std::__cxx11::to_string(&local_d0,(unsigned_long)pvVar5);
        main::$_1::operator()[abi_cxx11_(&local_b0,pvVar5,para);
        HotRingInstance::HotRing::update(&ht,&local_d0,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      pvVar5 = (void *)0x3a98;
      while( true ) {
        if (pvVar5 == (void *)0x7530) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Pass update test.\n");
          std::endl<char,std::char_traits<char>>(poVar4);
          std::_Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
          ~_Vector_base(&ht.table.
                         super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                       );
          return 0;
        }
        std::__cxx11::to_string(&local_d0,(unsigned_long)pvVar5);
        phVar3 = HotRingInstance::HotRing::search(&ht,&local_d0);
        __lhs = HotRingInstance::htEntry::get_val_abi_cxx11_(phVar3);
        main::$_1::operator()[abi_cxx11_(&local_b0,pvVar5,para_00);
        _Var1 = std::operator==(__lhs,&local_b0);
        if (!_Var1) break;
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        pvVar5 = (void *)((long)pvVar5 + 1);
      }
      __assertion = "ht.search(to_string(i))->get_val() == changeUpdateValue(i)";
      __line = 0x32;
LAB_00102671:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                    ,__line,"int main()");
    }
    std::__cxx11::to_string(&local_d0,uVar6);
    iVar2 = HotRingInstance::HotRing::remove(&ht,(char *)&local_d0);
    if ((char)iVar2 != '\0') {
      __assertion = "!ht.remove(to_string(i))";
      __line = 0x28;
      goto LAB_00102671;
    }
    std::__cxx11::string::~string((string *)&local_d0);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int main(){
    HotRingInstance::HotRing ht(buckets);
    auto changeValue = [](size_t para) -> string {
        return to_string(para) + "a";
    };

    auto changeUpdateValue = [](size_t para) -> string {
        return to_string(para) + "aaaaa";
    };

    for (size_t i = 0; i < buckets*len; i++){ // 链平均长度为3
        ht.insert(to_string(i), changeValue(i));
    }


    for (size_t i = 0; i < buckets*len/2; i++){
        assert(ht.remove(to_string(i)));
    }

    for (size_t i = 0; i < buckets*len; i++){
        if(i < buckets*len/2){
            assert(!ht.search(to_string(i)));
        } else {
            assert(ht.search(to_string(i)));
        }
    }

    cout << "Pass remove test.\n" << endl;

    for (size_t i = buckets*len; i < buckets*len*2; i++){
        assert(!ht.remove(to_string(i)));
    }

    cout << "Pass remove out of bound test.\n" << endl;

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        ht.update(to_string(i), changeUpdateValue(i));
    }

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        assert(ht.search(to_string(i))->get_val() == changeUpdateValue(i));
    }

    cout << "Pass update test.\n" << endl;
    return 0;
}